

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

void Abc_NodeMffcConeSupp_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vCone,Vec_Ptr_t *vSupp,int fTopmost)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  int local_34;
  int i;
  Abc_Obj_t *pFanin;
  int fTopmost_local;
  Vec_Ptr_t *vSupp_local;
  Vec_Ptr_t *vCone_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    if ((fTopmost == 0) &&
       ((iVar1 = Abc_ObjIsCi(pNode), iVar1 != 0 || (0 < (pNode->vFanouts).nSize)))) {
      if (vSupp != (Vec_Ptr_t *)0x0) {
        Vec_PtrPush(vSupp,pNode);
      }
    }
    else {
      for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_34 < iVar1; local_34 = local_34 + 1)
      {
        pNode_00 = Abc_ObjFanin(pNode,local_34);
        Abc_NodeMffcConeSupp_rec(pNode_00,vCone,vSupp,0);
      }
      if (vCone != (Vec_Ptr_t *)0x0) {
        Vec_PtrPush(vCone,pNode);
      }
    }
  }
  return;
}

Assistant:

void Abc_NodeMffcConeSupp_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vCone, Vec_Ptr_t * vSupp, int fTopmost )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // add to the new support nodes
    if ( !fTopmost && (Abc_ObjIsCi(pNode) || pNode->vFanouts.nSize > 0) )
    {
        if ( vSupp ) Vec_PtrPush( vSupp, pNode );
        return;
    }
    // recur on the children
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_NodeMffcConeSupp_rec( pFanin, vCone, vSupp, 0 );
    // collect the internal node
    if ( vCone ) Vec_PtrPush( vCone, pNode );
//    printf( "%d ", pNode->Id );
}